

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_1::FormatLineOptions
               (int depth,Message *options,DescriptorPool *pool,string *output)

{
  undefined8 output_00;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference value;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_options;
  allocator local_49;
  undefined1 local_48 [8];
  string prefix;
  string *output_local;
  DescriptorPool *pool_local;
  Message *options_local;
  int depth_local;
  
  prefix.field_2._8_8_ = output;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  bVar1 = RetrieveOptions(depth,options,pool,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_78);
  if (bVar1) {
    for (local_7c = 0; uVar2 = (ulong)local_7c,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_78), output_00 = prefix.field_2._8_8_, uVar2 < sVar3;
        local_7c = local_7c + 1) {
      strings::internal::SubstituteArg::SubstituteArg(&local_b0,(string *)local_48);
      value = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_78,(long)local_7c);
      strings::internal::SubstituteArg::SubstituteArg(&local_e0,value);
      strings::internal::SubstituteArg::SubstituteArg(&local_110);
      strings::internal::SubstituteArg::SubstituteArg(&local_140);
      strings::internal::SubstituteArg::SubstituteArg(&local_170);
      strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
      strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
      strings::internal::SubstituteArg::SubstituteArg(&local_200);
      strings::internal::SubstituteArg::SubstituteArg(&local_230);
      strings::internal::SubstituteArg::SubstituteArg(&local_260);
      strings::SubstituteAndAppend
                ((string *)output_00,"$0option $1;\n",&local_b0,&local_e0,&local_110,&local_140,
                 &local_170,&local_1a0,&local_1d0,&local_200,&local_230,&local_260);
    }
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool FormatLineOptions(int depth, const Message& options,
                       const DescriptorPool* pool, string* output) {
  string prefix(depth * 2, ' ');
  std::vector<string> all_options;
  if (RetrieveOptions(depth, options, pool, &all_options)) {
    for (int i = 0; i < all_options.size(); i++) {
      strings::SubstituteAndAppend(output, "$0option $1;\n",
                                   prefix, all_options[i]);
    }
  }
  return !all_options.empty();
}